

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIASound.cpp
# Opt level: O1

void __thiscall
Atari2600::TIASound::apply_samples<(Outputs::Speaker::Action)2>
          (TIASound *this,size_t number_of_samples,MonoSample *target)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  if (number_of_samples != 0) {
    uVar4 = 0;
    do {
      lVar6 = 0xc;
      do {
        iVar3 = *(int *)(this->volume_ + lVar6 * 4 + -8) + 1;
        *(int *)(this->volume_ + lVar6 * 4 + -8) = iVar3;
        if (0xe < this->volume_[lVar6 + -8] - 1) goto switchD_0030200a_caseD_4;
        iVar3 = iVar3 / 0x13;
        switch((uint)this->volume_[lVar6 + -8]) {
        case 1:
          if (iVar3 == this->volume_[lVar6 + -10] + 1) {
            iVar3 = *(int *)(this->volume_ + lVar6 * 4 + -0x28);
            *(undefined4 *)(this->volume_ + lVar6 * 4 + -8) = 0;
LAB_0030209e:
            *(uint *)(this->volume_ + lVar6 * 4 + -0x28) =
                 (iVar3 << 2 ^ iVar3 * 8) & 8U | iVar3 >> 1;
          }
          break;
        case 2:
          bVar1 = this->volume_[lVar6 + -10];
          if (iVar3 % (int)(((uint)bVar1 * 0x20 - ((uint)bVar1 + (uint)bVar1)) + 0x1e) == 0x12) {
            iVar3 = *(int *)(this->volume_ + lVar6 * 4 + -0x28);
            goto LAB_0030209e;
          }
          break;
        case 3:
          if (iVar3 != this->volume_[lVar6 + -10] + 1) break;
          if ((this->volume_[lVar6 * 4 + -0x20] & 1) != 0) {
            uVar2 = *(uint *)(this->volume_ + lVar6 * 4 + -0x28);
            *(uint *)(this->volume_ + lVar6 * 4 + -0x10) = uVar2 & 1;
            *(uint *)(this->volume_ + lVar6 * 4 + -0x28) =
                 (uVar2 << 2 ^ uVar2 * 8) & 8 | (int)uVar2 >> 1;
          }
          iVar3 = *(int *)(this->volume_ + lVar6 * 4 + -0x20);
          goto LAB_0030211f;
        case 7:
        case 9:
          iVar5 = this->volume_[lVar6 + -10] + 1;
          goto LAB_003020c8;
        case 8:
          if (iVar3 == this->volume_[lVar6 + -10] + 1) {
            iVar3 = *(int *)(this->volume_ + lVar6 * 4 + -0x18);
            *(undefined4 *)(this->volume_ + lVar6 * 4 + -8) = 0;
            *(uint *)(this->volume_ + lVar6 * 4 + -0x18) =
                 (iVar3 << 8 ^ iVar3 << 4) & 0x100U | iVar3 >> 1;
          }
          break;
        case 0xf:
          iVar5 = (uint)this->volume_[lVar6 + -10] + (uint)this->volume_[lVar6 + -10] * 2 + 3;
LAB_003020c8:
          if (iVar3 == iVar5) {
            iVar3 = *(int *)(this->volume_ + lVar6 * 4 + -0x20);
            *(undefined4 *)(this->volume_ + lVar6 * 4 + -8) = 0;
LAB_0030211f:
            *(uint *)(this->volume_ + lVar6 * 4 + -0x20) =
                 (iVar3 << 2 ^ iVar3 << 4) & 0x10U | iVar3 >> 1;
          }
        }
switchD_0030200a_caseD_4:
        lVar6 = lVar6 + 1;
      } while (lVar6 == 0xd);
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (uVar4 < number_of_samples);
  }
  return;
}

Assistant:

void Atari2600::TIASound::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	for(unsigned int c = 0; c < number_of_samples; c++) {
		Outputs::Speaker::MonoSample output = 0;
		for(int channel = 0; channel < 2; channel++) {
			divider_counter_[channel] ++;
			int divider_value = divider_counter_[channel] / (38 / CPUTicksPerAudioTick);
			int level = 0;
			switch(control_[channel]) {
				case 0x0: case 0xb:	// constant 1
					level = 1;
				break;

				case 0x4: case 0x5:	// div2 tone
					level = (divider_value / (divider_[channel]+1))&1;
				break;

				case 0xc: case 0xd:	// div6 tone
					level = (divider_value / ((divider_[channel]+1)*3))&1;
				break;

				case 0x6: case 0xa:	// div31 tone
					level = (divider_value / (divider_[channel]+1))%30 <= 18;
				break;

				case 0xe:			// div93 tone
					level = (divider_value / ((divider_[channel]+1)*3))%30 <= 18;
				break;

				case 0x1:			// 4-bit poly
					level = poly4_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly4(channel);
					}
				break;

				case 0x2:			// 4-bit poly div31
					level = poly4_counter_[channel]&1;
					if(divider_value%(30*(divider_[channel]+1)) == 18) {
						advance_poly4(channel);
					}
				break;

				case 0x3:			// 5/4-bit poly
					level = output_state_[channel];
					if(divider_value == divider_[channel]+1) {
						if(poly5_counter_[channel]&1) {
							output_state_[channel] = poly4_counter_[channel]&1;
							advance_poly4(channel);
						}
						advance_poly5(channel);
					}
				break;

				case 0x7: case 0x9:	// 5-bit poly
					level = poly5_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0xf:			// 5-bit poly div6
					level = poly5_counter_[channel]&1;
					if(divider_value == (divider_[channel]+1)*3) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0x8:			// 9-bit poly
					level = poly9_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly9(channel);
					}
				break;
			}

			output += (volume_[channel] * per_channel_volume_ * level) >> 4;
		}
		Outputs::Speaker::apply<action>(target[c], output);
	}
}